

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O0

void __thiscall
CapabilitiesToStateMask::CapabilitiesToStateMask
          (CapabilitiesToStateMask *this,Capabilities capabilities)

{
  Int IVar1;
  Int in_ESI;
  CapabilitiesToStateMask *in_RDI;
  long in_FS_OFFSET;
  Capability other;
  CapabilitiesToStateMask *this_00;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_24;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_20;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_1c;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_18;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_14;
  QFlagsStorageHelper<QBlittable::Capability,_4> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->m_capabilities).super_QFlagsStorageHelper<QBlittable::Capability,_4>.
  super_QFlagsStorage<QBlittable::Capability>.i = in_ESI;
  in_RDI->fillRectMask = 0;
  in_RDI->drawRectMask = 0;
  in_RDI->drawPixmapMask = 0;
  in_RDI->alphaFillRectMask = 0;
  in_RDI->opacityPixmapMask = 0;
  in_RDI->capabillitiesState = 0;
  this_00 = in_RDI;
  local_10.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&
                 (&in_RDI->m_capabilities,(Capability)((ulong)in_RDI >> 0x20));
  other = (Capability)((ulong)in_RDI >> 0x20);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
  if (IVar1 != 0) {
    setFillRectMask(this_00);
  }
  local_14.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&(&this_00->m_capabilities,other);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
  if (IVar1 != 0) {
    setSourcePixmapMask(this_00);
  }
  local_18.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&(&this_00->m_capabilities,other);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_18);
  if (IVar1 != 0) {
    setSourceOverPixmapMask((CapabilitiesToStateMask *)0x55e9d9);
  }
  local_1c.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&(&this_00->m_capabilities,other);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1c);
  if (IVar1 != 0) {
    setSourceOverScaledPixmapMask(this_00);
  }
  local_20.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&(&this_00->m_capabilities,other);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_20);
  if (IVar1 != 0) {
    setAlphaFillRectMask(this_00);
  }
  local_24.super_QFlagsStorage<QBlittable::Capability>.i =
       (QFlagsStorage<QBlittable::Capability>)
       QFlags<QBlittable::Capability>::operator&(&this_00->m_capabilities,other);
  IVar1 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_24);
  if (IVar1 != 0) {
    setOpacityPixmapMask(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CapabilitiesToStateMask(QBlittable::Capabilities capabilities)
        : m_capabilities(capabilities)
        , fillRectMask(0)
        , drawRectMask(0)
        , drawPixmapMask(0)
        , alphaFillRectMask(0)
        , opacityPixmapMask(0)
        , capabillitiesState(0)
    {
        if (capabilities & QBlittable::SolidRectCapability)
            setFillRectMask();
        if (capabilities & QBlittable::SourcePixmapCapability)
           setSourcePixmapMask();
        if (capabilities & QBlittable::SourceOverPixmapCapability)
           setSourceOverPixmapMask();
        if (capabilities & QBlittable::SourceOverScaledPixmapCapability)
            setSourceOverScaledPixmapMask();
        if (capabilities & QBlittable::AlphaFillRectCapability)
            setAlphaFillRectMask();
        if (capabilities & QBlittable::OpacityPixmapCapability)
            setOpacityPixmapMask();
    }